

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdAddMultisigSignDataToDer
              (void *handle,void *multisign_handle,char *signature,int sighash_type,
              bool sighash_anyone_can_pay,char *related_pubkey)

{
  bool bVar1;
  int iVar2;
  CfdException *this;
  ByteData signature_der;
  ByteData signature_bytes;
  SigHashType sighashtype;
  SignParameter param;
  ByteData local_110;
  ByteData local_f8;
  SigHashType local_e0;
  SigHashType local_d4;
  string local_c8;
  SignParameter local_a8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (!bVar1) {
    cfd::core::SigHashType::Create(&local_d4,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
    std::__cxx11::string::string((string *)&local_a8,signature,(allocator *)&local_c8);
    cfd::core::ByteData::ByteData(&local_f8,(string *)&local_a8);
    if ((pointer *)
        local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer *)
        ((long)&local_a8.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 0x10U)) {
      operator_delete(local_a8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::SigHashType::SigHashType(&local_e0,&local_d4);
    cfd::SignParameter::SignParameter(&local_a8,&local_f8,true,&local_e0);
    cfd::SignParameter::ConvertToSignature(&local_110,&local_a8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_c8,&local_110);
    iVar2 = CfdAddMultisigSignData(handle,multisign_handle,local_c8._M_dataplus._M_p,related_pubkey)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_a8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00734d50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.op_code_.text_data_._M_dataplus._M_p != &local_a8.op_code_.text_data_.field_2) {
      operator_delete(local_a8.op_code_.text_data_._M_dataplus._M_p);
    }
    if (local_a8.related_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.related_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return iVar2;
  }
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x7ad;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdAddMultisigSignDataToDer";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,"signature is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Failed to parameter. signature is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_a8);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddMultisigSignDataToDer(
    void* handle, void* multisign_handle, const char* signature,
    int sighash_type, bool sighash_anyone_can_pay,
    const char* related_pubkey) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }

    // encode to der
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData signature_bytes = ByteData(std::string(signature));
    SignParameter param(signature_bytes, true, sighashtype);
    ByteData signature_der = param.ConvertToSignature();

    return CfdAddMultisigSignData(
        handle, multisign_handle, signature_der.GetHex().c_str(),
        related_pubkey);
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}